

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::HttpServer::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 *puVar1;
  StringPtr *pSVar2;
  bool bVar3;
  bool bVar4;
  ArrayPtr<const_char> word3;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  char *pcVar5;
  size_t sVar6;
  char cVar7;
  byte bVar8;
  long lVar9;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  _func_int **pp_Var12;
  undefined4 in_register_00000034;
  long lVar13;
  long *plVar14;
  undefined4 in_register_00000084;
  HttpHeaders *in_R9;
  HttpOutputStream *this_00;
  uint i;
  ArrayPtr<const_char> word1;
  ArrayPtr<const_char> word2;
  char *in_stack_00000008;
  CappedArray<char,_14UL> statusCodeStr;
  String lengthStr;
  _func_int **local_148;
  size_t *local_140;
  ArrayDisposer *local_138;
  undefined1 local_128 [16];
  ArrayDisposer *local_118;
  HttpHeaders *local_110;
  String local_108;
  _func_int **local_e8;
  _func_int **pp_Stack_e0;
  ArrayDisposer *local_d8;
  StringPtr *local_c8;
  size_t sStack_c0;
  size_t local_b8;
  size_t sStack_b0;
  StringPtr local_a8 [5];
  size_t local_58;
  long local_50;
  size_t local_48;
  long local_40 [2];
  
  lVar13 = CONCAT44(in_register_00000034,__fd);
  if (*(char *)(lVar13 + 0x148) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1eae,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal((Fault *)local_a8);
  }
  local_140 = &local_58;
  bVar3 = *(int *)(lVar13 + 0x158) != 1;
  bVar4 = *(int *)(lVar13 + 0x150) != 1;
  *(undefined1 *)(lVar13 + 0x148) = 0;
  if (*(int *)(lVar13 + 0x150) - 1U < 2) {
    *(undefined4 *)(lVar13 + 0x150) = 0;
  }
  lVar9 = 8;
  do {
    *(char **)((long)local_a8 + lVar9 + -8) = "";
    *(undefined8 *)((long)&local_a8[0].content.ptr + lVar9) = 1;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x78);
  local_e8 = (_func_int **)0x0;
  pp_Stack_e0 = (_func_int **)0x0;
  local_d8 = (ArrayDisposer *)0x0;
  bVar8 = *(byte *)(lVar13 + 0x164);
  local_110 = in_R9;
  if (bVar8 == 0) {
    if ((*(char *)(*(long *)(lVar13 + 0x18) + 0x70) != '\x01') ||
       (*(char *)(lVar13 + 0x165) == '\x01')) {
      puVar1 = *(undefined8 **)(*(long *)(lVar13 + 0x18) + 0x58);
      if (puVar1 != (undefined8 *)0x0) {
        cVar7 = (**(code **)*puVar1)();
        if (cVar7 != '\0') goto LAB_003d6685;
        bVar8 = *(byte *)(lVar13 + 0x164);
      }
      goto LAB_003d6696;
    }
LAB_003d6685:
    *(undefined1 *)(lVar13 + 0x164) = 1;
LAB_003d669a:
    local_a8[0].content.ptr = "close";
    local_a8[0].content.size_ = 6;
  }
  else {
LAB_003d6696:
    if ((bVar8 & 1) != 0) goto LAB_003d669a;
  }
  plVar14 = &local_50;
  local_138 = (ArrayDisposer *)0x0;
  i = (uint)__buf;
  if (i == 0xcc) {
    pp_Var12 = (_func_int **)0x0;
    local_148 = (_func_int **)0x0;
LAB_003d67bd:
    sStack_c0 = 7;
    if (!bVar3 && !bVar4) goto LAB_003d67c7;
  }
  else {
    if (i == 0xcd) {
      lVar9 = 2;
      pp_Var10 = (_func_int **)0x4f9983;
LAB_003d67a7:
      local_138 = (ArrayDisposer *)0x0;
      pp_Var12 = (_func_int **)0x0;
      local_148 = (_func_int **)0x0;
LAB_003d67b2:
      *local_140 = (size_t)pp_Var10;
      *plVar14 = lVar9;
      goto LAB_003d67bd;
    }
    pp_Var12 = (_func_int **)0x0;
    local_148 = (_func_int **)0x0;
    if (i == 0x130) goto LAB_003d67bd;
    if (*in_stack_00000008 != '\x01') {
      lVar9 = 8;
      pp_Var10 = (_func_int **)0x4f0f3c;
      plVar14 = local_40;
      local_140 = &local_48;
      goto LAB_003d67a7;
    }
    if ((bVar3 || bVar4) || (*(long *)(in_stack_00000008 + 8) != 0)) {
      str<unsigned_long&>((String *)local_128,(kj *)(in_stack_00000008 + 8),(unsigned_long *)0x0);
      local_e8 = (_func_int **)local_128._0_8_;
      pp_Stack_e0 = (_func_int **)local_128._8_8_;
      local_138 = local_118;
      local_d8 = local_118;
      local_148 = (_func_int **)local_128._0_8_;
      pp_Var10 = (_func_int **)0x4b4903;
      if ((_func_int **)local_128._8_8_ != (_func_int **)0x0) {
        pp_Var10 = (_func_int **)local_128._0_8_;
      }
      lVar9 = local_128._8_8_ + (ulong)((_func_int **)local_128._8_8_ == (_func_int **)0x0);
      plVar14 = &local_50;
      pp_Var12 = (_func_int **)local_128._8_8_;
      goto LAB_003d67b2;
    }
    local_138 = (ArrayDisposer *)0x0;
    pp_Var12 = (_func_int **)0x0;
    local_148 = (_func_int **)0x0;
LAB_003d67c7:
    pSVar2 = (local_110->indexedHeaders).ptr;
    if ((1 < pSVar2[5].content.size_) || (sStack_c0 = 7, 1 < pSVar2[6].content.size_)) {
      sStack_c0 = 5;
    }
  }
  local_c8 = local_a8;
  kj::_::Stringifier::operator*((CappedArray<char,_14UL> *)local_128,(Stringifier *)&kj::_::STR,i);
  sStack_b0 = CONCAT44(in_register_00000084,__flags) - 1;
  word3.size_ = sStack_b0;
  word3.ptr = (char *)__n;
  connectionHeaders.size_ = sStack_c0;
  connectionHeaders.ptr = local_c8;
  word1.size_ = 8;
  word1.ptr = "HTTP/1.1";
  word2.size_ = local_128._0_8_;
  word2.ptr = local_128 + 8;
  local_b8 = __n;
  HttpHeaders::serialize(&local_108,local_110,word1,word2,word3,connectionHeaders);
  this_00 = (HttpOutputStream *)(lVar13 + 0x128);
  anon_unknown_36::HttpOutputStream::writeHeaders(this_00,&local_108);
  sVar6 = local_108.content.size_;
  pcVar5 = local_108.content.ptr;
  if (local_108.content.ptr != (char *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    (**(local_108.content.disposer)->_vptr_ArrayDisposer)
              (local_108.content.disposer,pcVar5,1,sVar6,sVar6,0);
  }
  if (bVar3 || bVar4) {
    if ((1 < i - 0xcc) && (i != 0x130)) {
      if (*in_stack_00000008 == '\x01') {
        heap<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&,unsigned_long&>
                  ((kj *)local_128,this_00,*(unsigned_long **)(in_stack_00000008 + 8));
      }
      else {
        heap<kj::(anonymous_namespace)::HttpChunkedEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&>
                  ((kj *)local_128,this_00);
      }
      (this->super_Response)._vptr_Response = (_func_int **)local_128._0_8_;
      (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)local_128._8_8_;
      goto LAB_003d691c;
    }
    anon_unknown_36::HttpOutputStream::finishBody(this_00);
    pp_Var10 = (_func_int **)operator_new(8);
    *pp_Var10 = (_func_int *)&PTR_write_00619ee0;
    pp_Var11 = (_func_int **)
               &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpNullEntityWriter>::instance;
  }
  else {
    anon_unknown_36::HttpOutputStream::finishBody(this_00);
    pp_Var10 = (_func_int **)operator_new(8);
    *pp_Var10 = (_func_int *)&PTR_write_00619e60;
    pp_Var11 = (_func_int **)
               &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>::instance
    ;
  }
  (this->super_Response)._vptr_Response = pp_Var11;
  (this->super_ConnectResponse)._vptr_ConnectResponse = pp_Var10;
LAB_003d691c:
  if (local_148 != (_func_int **)0x0) {
    local_e8 = (_func_int **)0x0;
    pp_Stack_e0 = (_func_int **)0x0;
    (**local_138->_vptr_ArrayDisposer)(local_138,local_148,1,pp_Var12,pp_Var12,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
      uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
      kj::Maybe<uint64_t> expectedBodySize) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    currentMethod = kj::none;

    kj::StringPtr connectionHeaders[HttpHeaders::CONNECTION_HEADERS_COUNT];
    kj::String lengthStr;

    if (!closeAfterSend) {
      // Check if application wants us to close connections.
      //
      // If the application used listenHttpCleanDrain() to listen, then it expects that after a
      // clean drain, the connection is still open and can receive more requests. Otherwise, after
      // receiving drain(), we will close the connection, so we should send a `Connection: close`
      // header.
      if (server.draining && !wantCleanDrain) {
        closeAfterSend = true;
      } else KJ_IF_SOME(c, server.settings.callbacks) {
        // The application has registered its own callback to decide whether to send
        // `Connection: close`.
        if (c.shouldClose()) {
          closeAfterSend = true;
        }
      }
    }

    if (closeAfterSend) {
      connectionHeaders[HttpHeaders::BuiltinIndices::CONNECTION] = "close";
    }

    bool isHeadRequest = method.tryGet<HttpMethod>().map([](auto& m) {
        return m == HttpMethod::HEAD;
      }).orDefault(false);

    if (statusCode == 204 || statusCode == 304) {
      // No entity-body.
    } else if (statusCode == 205) {
      // Status code 205 also has no body, but unlike 204 and 304, it must explicitly encode an
      // empty body, e.g. using content-length: 0. I'm guessing this is one of those things,
      // where some early clients expected an explicit body while others assumed an empty body,
      // and so the standard had to choose the common denominator.
      //
      // Spec: https://tools.ietf.org/html/rfc7231#section-6.3.6
      connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = "0";
    } else KJ_IF_SOME(s, expectedBodySize) {
      // HACK: We interpret a zero-length expected body length on responses to HEAD requests to
      //   mean "don't set a Content-Length header at all." This provides a way to omit a body
      //   header on HEAD responses with non-null-body status codes. This is a hack that *only*
      //   makes sense for HEAD responses.
      if (!isHeadRequest || s > 0) {
        lengthStr = kj::str(s);
        connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = lengthStr;
      }
    } else {
      connectionHeaders[HttpHeaders::BuiltinIndices::TRANSFER_ENCODING] = "chunked";
    }